

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

hash_entry_t * lookup(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  int32 iVar1;
  size_t sVar2;
  hash_entry_s *entry;
  
  if (h->table[hash].key != (char *)0x0) {
    entry = h->table + hash;
    if (h->nocase == 0) {
      do {
        if (entry->len == len) {
          if (len == 0) {
            return entry;
          }
          sVar2 = 0;
          while (entry->key[sVar2] == key[sVar2]) {
            sVar2 = sVar2 + 1;
            if (len == sVar2) {
              return entry;
            }
          }
        }
        entry = entry->next;
      } while (entry != (hash_entry_s *)0x0);
    }
    else {
      do {
        if ((entry->len == len) && (iVar1 = keycmp_nocase(entry,key), iVar1 == 0)) {
          return entry;
        }
        entry = entry->next;
      } while (entry != (hash_entry_s *)0x0);
    }
  }
  return (hash_entry_t *)0x0;
}

Assistant:

static hash_entry_t *
lookup(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry;

    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0)))
            entry = entry->next;
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0)))
            entry = entry->next;
    }

    return entry;
}